

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::insert
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,qsizetype n,parameter_type t)

{
  uint uVar1;
  Inserter *in_RCX;
  long lVar2;
  long in_RDX;
  QArrayDataPointer<QXdgDBusImageStruct> *in_RSI;
  QXdgDBusImageStruct *in_RDI;
  long in_FS_OFFSET;
  bool bVar3;
  GrowthPosition pos;
  bool growsAtBegin;
  QXdgDBusImageStruct copy;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  uint uVar5;
  Inserter local_50;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QXdgDBusImageStruct::QXdgDBusImageStruct
            ((QXdgDBusImageStruct *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_RDI);
  bVar3 = (in_RDI->data).d.ptr != (char *)0x0;
  uVar4 = bVar3 && in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)0x0;
  uVar5 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffff8c);
  uVar1 = (uint)(bVar3 && in_RSI == (QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),(qsizetype)in_RCX,
             (QXdgDBusImageStruct **)CONCAT44(uVar5,uVar1),
             (QArrayDataPointer<QXdgDBusImageStruct> *)CONCAT17(uVar4,in_stack_ffffffffffffff80));
  if ((uVar5 & 0x1000000) == 0) {
    Inserter::Inserter(in_RCX,(QArrayDataPointer<QXdgDBusImageStruct> *)CONCAT44(uVar5,uVar1),
                       CONCAT17(uVar4,in_stack_ffffffffffffff80),(qsizetype)in_RDI);
    Inserter::insertFill
              (in_RCX,(QXdgDBusImageStruct *)CONCAT44(uVar5,uVar1),
               CONCAT17(uVar4,in_stack_ffffffffffffff80));
    Inserter::~Inserter(&local_50);
  }
  else {
    while (lVar2 = in_RDX + -1, in_RDX != 0) {
      QArrayDataPointer<QXdgDBusImageStruct>::begin
                ((QArrayDataPointer<QXdgDBusImageStruct> *)0xb38788);
      QXdgDBusImageStruct::QXdgDBusImageStruct
                ((QXdgDBusImageStruct *)CONCAT17(uVar4,in_stack_ffffffffffffff80),in_RDI);
      (in_RDI->data).d.d = (in_RDI->data).d.d + -2;
      (in_RDI->data).d.ptr = (in_RDI->data).d.ptr + 1;
      in_RDX = lVar2;
    }
  }
  QXdgDBusImageStruct::~QXdgDBusImageStruct((QXdgDBusImageStruct *)0xb387f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }